

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

ly_set * ly_set_dup(ly_set *set)

{
  lys_node **pplVar1;
  ly_set *new;
  ly_set *set_local;
  
  if (set == (ly_set *)0x0) {
    set_local = (ly_set *)0x0;
  }
  else {
    set_local = (ly_set *)malloc(0x10);
    if (set_local == (ly_set *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_dup");
      set_local = (ly_set *)0x0;
    }
    else {
      set_local->number = set->number;
      set_local->size = set->size;
      pplVar1 = (lys_node **)malloc((ulong)set_local->size << 3);
      (set_local->set).s = pplVar1;
      if ((set_local->set).s == (lys_node **)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_dup");
        free(set_local);
        set_local = (ly_set *)0x0;
      }
      else {
        memcpy((set_local->set).s,(set->set).s,(ulong)set_local->size << 3);
      }
    }
  }
  return set_local;
}

Assistant:

ly_set *
ly_set_dup(const struct ly_set *set)
{
    struct ly_set *new;

    if (!set) {
        return NULL;
    }

    new = malloc(sizeof *new);
    LY_CHECK_ERR_RETURN(!new, LOGMEM(NULL), NULL);
    new->number = set->number;
    new->size = set->size;
    new->set.g = malloc(new->size * sizeof *(new->set.g));
    LY_CHECK_ERR_RETURN(!new->set.g, LOGMEM(NULL); free(new), NULL);
    memcpy(new->set.g, set->set.g, new->size * sizeof *(new->set.g));

    return new;
}